

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_mobj.cpp
# Opt level: O2

AActor * AActor::StaticSpawn(PClassActor *type,DVector3 *pos,replace_t allowreplacement,
                            bool SpawningMapThing)

{
  byte *pbVar1;
  uint uVar2;
  FState *this;
  sector_t *psVar3;
  double dVar4;
  bool bVar5;
  int iVar6;
  AActor *this_00;
  PClass *pPVar7;
  FStrifeDialogueNode *pFVar8;
  FRandom *this_01;
  double dVar9;
  FName local_4c;
  DVector2 local_48;
  
  if (type == (PClassActor *)0x0) {
    I_Error("Tried to spawn a class-less actor\n");
  }
  if (allowreplacement != NO_REPLACE) {
    type = PClassActor::GetReplacement(type,true);
  }
  this_00 = (AActor *)PClass::CreateNew(&type->super_PClass);
  pPVar7 = DObject::GetClass((DObject *)this_00);
  local_4c.Index = (pPVar7->super_PNativeStruct).super_PStruct.super_PNamedType.TypeName.Index;
  iVar6 = GetConversation(&local_4c);
  this_00->ConversationRoot = iVar6;
  if (iVar6 == -1) {
    pFVar8 = (FStrifeDialogueNode *)0x0;
  }
  else {
    pFVar8 = StrifeDialogues.Array[iVar6];
  }
  this_00->Conversation = pFVar8;
  (this_00->__Pos).Z = pos->Z;
  dVar4 = pos->Y;
  (this_00->__Pos).X = pos->X;
  (this_00->__Pos).Y = dVar4;
  (this_00->OldRenderPos).Z = 3.4028234663852886e+38;
  (this_00->OldRenderPos).X = 3.4028234663852886e+38;
  (this_00->OldRenderPos).Y = 3.4028234663852886e+38;
  (this_00->picnum).texnum = -1;
  iVar6 = SpawnHealth(this_00);
  this_00->health = iVar6;
  if ((this_00->Gravity == 0.0) && (!NAN(this_00->Gravity))) {
    pbVar1 = (byte *)((long)&(this_00->flags).Value + 1);
    *pbVar1 = *pbVar1 | 2;
  }
  this_01 = &pr_spawnmobj;
  if (bglobal.m_Thinking != false) {
    this_01 = &pr_botspawnmobj;
  }
  bVar5 = isFast(this_00);
  uVar2 = (this_00->flags3).Value;
  if (bVar5) {
    if ((uVar2 >> 0xd & 1) != 0) {
      this_00->reactiontime = 0;
LAB_00429c54:
      iVar6 = FRandom::operator()(this_01);
      this_00->LastLookPlayerNumber = (SBYTE)(iVar6 % 8);
      this_00->TIDtoHate = 0;
    }
  }
  else if ((uVar2 >> 0xd & 1) != 0) goto LAB_00429c54;
  this = this_00->SpawnState;
  this_00->state = this;
  iVar6 = FState::GetTics(this);
  this_00->tics = iVar6;
  this_00->sprite = this->sprite;
  this_00->frame = this->Frame;
  (this_00->renderflags).Value =
       ((this_00->renderflags).Value & 0xffffffef) + (this->StateFlags & 4) * 4;
  this_00->touching_sectorlist = (msecnode_t *)0x0;
  this_00->touching_rendersectors = (msecnode_t *)0x0;
  iVar6 = G_SkillProperty(SKILLP_FastMonsters);
  if ((iVar6 != 0) &&
     (pPVar7 = DObject::GetClass((DObject *)this_00),
     0.0 <= (double)pPVar7[1].super_PNativeStruct.super_PStruct.super_PNamedType.super_PCompoundType
                    .super_PType.PredType)) {
    pPVar7 = DObject::GetClass((DObject *)this_00);
    this_00->Speed =
         (double)pPVar7[1].super_PNativeStruct.super_PStruct.super_PNamedType.super_PCompoundType.
                 super_PType.PredType;
  }
  LinkToWorld(this_00,(FLinkContext *)0x0,SpawningMapThing,(sector_t *)0x0);
  ClearInterpolation(this_00);
  local_48.X = pos->X;
  local_48.Y = pos->Y;
  dVar4 = secplane_t::ZatPoint(&this_00->Sector->floorplane,&local_48);
  this_00->floorz = dVar4;
  this_00->dropoffz = dVar4;
  local_48.X = pos->X;
  local_48.Y = pos->Y;
  dVar9 = secplane_t::ZatPoint(&this_00->Sector->ceilingplane,&local_48);
  this_00->ceilingz = dVar9;
  dVar4 = pos->Z;
  if (((dVar4 == -2147483648.0) && (!NAN(dVar4))) || ((dVar4 == 2147483646.0 && (!NAN(dVar4))))) {
    dVar9 = this_00->floorz;
LAB_00429db5:
    (this_00->__Pos).Z = dVar9;
  }
  else if ((dVar4 == 2147483647.0) && (!NAN(dVar4))) {
    dVar9 = dVar9 - this_00->Height;
    goto LAB_00429db5;
  }
  if (SpawningMapThing) {
    psVar3 = this_00->Sector;
    this_00->floorsector = psVar3;
    (this_00->floorpic).texnum = psVar3->planes[0].Texture.texnum;
    iVar6 = sector_t::GetTerrain(psVar3,0);
    this_00->floorterrain = iVar6;
    this_00->ceilingsector = this_00->Sector;
    (this_00->ceilingpic).texnum = this_00->Sector->planes[1].Texture.texnum;
  }
  else {
    bVar5 = PClass::IsAncestorOf(APlayerPawn::RegistrationInfo.MyClass,&type->super_PClass);
    if (bVar5) {
      if (((this_00->flags5).Value & 0x200000) != 0) {
        psVar3 = this_00->Sector;
        (this_00->floorpic).texnum = psVar3->planes[0].Texture.texnum;
        iVar6 = sector_t::GetTerrain(psVar3,0);
        this_00->floorterrain = iVar6;
        psVar3 = this_00->Sector;
        this_00->floorsector = psVar3;
        (this_00->ceilingpic).texnum = psVar3->planes[1].Texture.texnum;
        this_00->ceilingsector = psVar3;
        goto LAB_00429e70;
      }
      iVar6 = 0;
    }
    else {
      iVar6 = 1;
    }
    P_FindFloorCeiling(this_00,iVar6);
  }
LAB_00429e70:
  dVar4 = pos->Y;
  (this_00->SpawnPoint).X = pos->X;
  (this_00->SpawnPoint).Y = dVar4;
  dVar4 = pos->Z;
  if ((dVar4 != -2147483648.0) || (NAN(dVar4))) {
    if ((dVar4 != 2147483647.0) || (NAN(dVar4))) {
      if ((dVar4 != 2147483646.0) || (NAN(dVar4))) {
        dVar4 = (this_00->__Pos).Z;
        dVar9 = secplane_t::ZatPoint(&this_00->Sector->floorplane,this_00);
        (this_00->SpawnPoint).Z = dVar4 - dVar9;
        goto LAB_00429ec0;
      }
      dVar4 = this_00->floorz;
      dVar9 = (this_00->ceilingz - this_00->Height) - dVar4;
      if (48.0 < dVar9) {
        iVar6 = FRandom::operator()(this_01);
        dVar4 = (double)iVar6 * (dVar9 + -40.0) * 0.00390625 + this_00->floorz + 40.0;
      }
    }
    else {
      dVar4 = this_00->ceilingz - this_00->Height;
    }
  }
  else {
    dVar4 = this_00->floorz;
  }
  (this_00->__Pos).Z = dVar4;
LAB_00429ec0:
  if (this_00->FloatBobPhase == 0xff) {
    iVar6 = FRandom::operator()(this_01);
    this_00->FloatBobPhase = (BYTE)iVar6;
  }
  if (((this_00->flags2).Value & 0x20) == 0) {
    this_00->Floorclip = 0.0;
  }
  else {
    AdjustFloorClip(this_00);
  }
  (*(this_00->super_DThinker).super_DObject._vptr_DObject[0x19])(this_00,0);
  if ((!SpawningMapThing) &&
     (CallBeginPlay(this_00), ((this_00->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0)) {
    return (AActor *)0x0;
  }
  if (((level.flags._3_1_ & 0x20) != 0) && (this_00->player == (player_t *)0x0)) {
    pbVar1 = (byte *)((long)&(this_00->flags).Value + 3);
    *pbVar1 = *pbVar1 & 0xf7;
  }
  uVar2 = (this_00->flags).Value;
  if ((uVar2 & 0x8400000) == 0x400000) {
    level.total_monsters = level.total_monsters + 1;
  }
  if ((uVar2 >> 0x17 & 1) != 0) {
    level.total_items = level.total_items + 1;
  }
  if (((this_00->flags5).Value & 0x10) != 0) {
    level.total_secrets = level.total_secrets + 1;
  }
  return this_00;
}

Assistant:

AActor *AActor::StaticSpawn (PClassActor *type, const DVector3 &pos, replace_t allowreplacement, bool SpawningMapThing)
{
	if (type == NULL)
	{
		I_Error ("Tried to spawn a class-less actor\n");
	}

	if (allowreplacement)
	{
		type = type->GetReplacement();
	}

	AActor *actor;
	
	actor = static_cast<AActor *>(const_cast<PClassActor *>(type)->CreateNew ());

	// Set default dialogue
	actor->ConversationRoot = GetConversation(actor->GetClass()->TypeName);
	if (actor->ConversationRoot != -1)
	{
		actor->Conversation = StrifeDialogues[actor->ConversationRoot];
	}
	else
	{
		actor->Conversation = NULL;
	}

	actor->SetXYZ(pos);
	actor->OldRenderPos = { FLT_MAX, FLT_MAX, FLT_MAX };
	actor->picnum.SetInvalid();
	actor->health = actor->SpawnHealth();

	// Actors with zero gravity need the NOGRAVITY flag set.
	if (actor->Gravity == 0) actor->flags |= MF_NOGRAVITY;

	FRandom &rng = bglobal.m_Thinking ? pr_botspawnmobj : pr_spawnmobj;

	if (actor->isFast() && actor->flags3 & MF3_ISMONSTER)
		actor->reactiontime = 0;

	if (actor->flags3 & MF3_ISMONSTER)
	{
		actor->LastLookPlayerNumber = rng() % MAXPLAYERS;
		actor->TIDtoHate = 0;
	}

	// Set the state, but do not use SetState, because action
	// routines can't be called yet.  If the spawnstate has an action
	// routine, it will not be called.
	FState *st = actor->SpawnState;
	actor->state = st;
	actor->tics = st->GetTics();
	
	actor->sprite = st->sprite;
	actor->frame = st->GetFrame();
	actor->renderflags = (actor->renderflags & ~RF_FULLBRIGHT) | ActorRenderFlags::FromInt (st->GetFullbright());
	actor->touching_sectorlist = nullptr;	// NULL head of sector list // phares 3/13/98
	actor->touching_rendersectors = nullptr;
	if (G_SkillProperty(SKILLP_FastMonsters) && actor->GetClass()->FastSpeed >= 0)
	actor->Speed = actor->GetClass()->FastSpeed;

	// set subsector and/or block links
	actor->LinkToWorld (nullptr, SpawningMapThing);
	actor->ClearInterpolation();

	actor->dropoffz = actor->floorz = actor->Sector->floorplane.ZatPoint(pos);
	actor->ceilingz = actor->Sector->ceilingplane.ZatPoint(pos);

	// The z-coordinate needs to be set once before calling P_FindFloorCeiling
	// For FLOATRANDZ just use the floor here.
	if (pos.Z == ONFLOORZ || pos.Z == FLOATRANDZ)
	{
		actor->SetZ(actor->floorz);
	}
	else if (pos.Z == ONCEILINGZ)
	{
		actor->SetZ(actor->ceilingz - actor->Height);
	}

	if (SpawningMapThing || !type->IsDescendantOf (RUNTIME_CLASS(APlayerPawn)))
	{
		// Check if there's something solid to stand on between the current position and the
		// current sector's floor. For map spawns this must be delayed until after setting the
		// z-coordinate.
		if (!SpawningMapThing) 
		{
			P_FindFloorCeiling(actor, FFCF_ONLYSPAWNPOS);
		}
		else
		{
			actor->floorsector = actor->Sector;
			actor->floorpic = actor->floorsector->GetTexture(sector_t::floor);
			actor->floorterrain = actor->floorsector->GetTerrain(sector_t::floor);
			actor->ceilingsector = actor->Sector;
			actor->ceilingpic = actor->ceilingsector->GetTexture(sector_t::ceiling);
		}
	}
	else if (!(actor->flags5 & MF5_NOINTERACTION))
	{
		P_FindFloorCeiling (actor);
	}
	else
	{
		actor->floorpic = actor->Sector->GetTexture(sector_t::floor);
		actor->floorterrain = actor->Sector->GetTerrain(sector_t::floor);
		actor->floorsector = actor->Sector;
		actor->ceilingpic = actor->Sector->GetTexture(sector_t::ceiling);
		actor->ceilingsector = actor->Sector;
	}

	actor->SpawnPoint.X = pos.X;
	actor->SpawnPoint.Y = pos.Y;
	// do not copy Z!

	if (pos.Z == ONFLOORZ)
	{
		actor->SetZ(actor->floorz);
	}
	else if (pos.Z == ONCEILINGZ)
	{
		actor->SetZ(actor->ceilingz - actor->Height);
	}
	else if (pos.Z == FLOATRANDZ)
	{
		double space = actor->ceilingz - actor->Height - actor->floorz;
		if (space > 48)
		{
			space -= 40;
			actor->SetZ( space * rng() / 256. + actor->floorz + 40);
		}
		else
		{
			actor->SetZ(actor->floorz);
		}
	}
	else
	{
		actor->SpawnPoint.Z = (actor->Z() - actor->Sector->floorplane.ZatPoint(actor));
	}

	if (actor->FloatBobPhase == (BYTE)-1) actor->FloatBobPhase = rng();	// Don't make everything bob in sync (unless deliberately told to do)
	if (actor->flags2 & MF2_FLOORCLIP)
	{
		actor->AdjustFloorClip ();
	}
	else
	{
		actor->Floorclip = 0;
	}
	actor->UpdateWaterLevel (false);
	if (!SpawningMapThing)
	{
		actor->CallBeginPlay ();
		if (actor->ObjectFlags & OF_EuthanizeMe)
		{
			return NULL;
		}
	}
	if (level.flags & LEVEL_NOALLIES && !actor->player)
	{
		actor->flags &= ~MF_FRIENDLY;
	}
	// [RH] Count monsters whenever they are spawned.
	if (actor->CountsAsKill())
	{
		level.total_monsters++;
	}
	// [RH] Same, for items
	if (actor->flags & MF_COUNTITEM)
	{
		level.total_items++;
	}
	// And for secrets
	if (actor->flags5 & MF5_COUNTSECRET)
	{
		level.total_secrets++;
	}
	return actor;
}